

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_86(QPDF *pdf,char *arg2)

{
  byte bVar1;
  __type_conflict1 _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  QPDFObjectHandle h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string result;
  undefined1 local_70 [8];
  string utf16_val;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string utf8_val;
  char *arg2_local;
  QPDF *pdf_local;
  
  utf8_val.field_2._8_8_ = arg2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"\x1f",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,anon_var_dwarf_1be8c,4,
             (allocator *)(result.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(result.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_98);
  bVar1 = QUtil::utf8_to_ascii((string *)local_38,(string *)local_98,'?');
  if ((bVar1 & 1) == 0) {
    __assert_fail("QUtil::utf8_to_ascii(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc15,"void test_86(QPDF &, const char *)");
  }
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_38);
  if (!_Var2) {
    __assert_fail("result == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc16,"void test_86(QPDF &, const char *)");
  }
  bVar1 = QUtil::utf8_to_pdf_doc((string *)local_38,(string *)local_98,'?');
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!QUtil::utf8_to_pdf_doc(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc17,"void test_86(QPDF &, const char *)");
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98,"?");
  if (!bVar3) {
    __assert_fail("result == \"?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc18,"void test_86(QPDF &, const char *)");
  }
  QUtil::utf8_to_utf16((string *)&local_b8);
  _Var2 = std::operator==(&local_b8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70);
  if (!_Var2) {
    __assert_fail("QUtil::utf8_to_utf16(utf8_val) == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc19,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_b8);
  QUtil::utf16_to_utf8
            ((string *)
             &h.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &h.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  if (!_Var2) {
    __assert_fail("QUtil::utf16_to_utf8(utf16_val) == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1a,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string
            ((string *)
             &h.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::newUnicodeString((string *)local_e8);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  _Var2 = std::operator==(&local_108,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_70);
  if (!_Var2) {
    __assert_fail("h.getStringValue() == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1c,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_108);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  _Var2 = std::operator==(&local_128,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  if (!_Var2) {
    __assert_fail("h.getUTF8Value() == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1d,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&local_128);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void
test_86(QPDF& pdf, char const* arg2)
{
    // Test symmetry between newUnicodeString and getUTF8Value for
    // strings that can't be encoded as PDFDoc but don't contain any
    // high code points.

    std::string utf8_val("\x1f");
    std::string utf16_val("\xfe\xff\x00\x1f", 4);
    std::string result;
    assert(QUtil::utf8_to_ascii(utf8_val, result, '?'));
    assert(result == utf8_val);
    assert(!QUtil::utf8_to_pdf_doc(utf8_val, result, '?'));
    assert(result == "?");
    assert(QUtil::utf8_to_utf16(utf8_val) == utf16_val);
    assert(QUtil::utf16_to_utf8(utf16_val) == utf8_val);
    auto h = QPDFObjectHandle::newUnicodeString(utf8_val);
    assert(h.getStringValue() == utf16_val);
    assert(h.getUTF8Value() == utf8_val);
}